

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O0

void UI::gather_slice_arg(int *argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  bool local_1f1;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  int local_140;
  allocator<char> local_139;
  int y2;
  int local_118;
  allocator<char> local_111;
  int x2;
  int local_f0;
  allocator<char> local_e9;
  int y1;
  int local_c8;
  byte local_c3;
  byte local_c2;
  allocator<char> local_c1;
  int x1;
  byte local_9b;
  byte local_9a;
  allocator<char> local_99;
  string local_98;
  byte local_73;
  byte local_72;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  char **local_18;
  char **argv_local;
  int *argc_local;
  
  pcVar1 = argv[4];
  local_18 = argv;
  argv_local = (char **)argc;
  std::allocator<char>::allocator();
  local_72 = 0;
  local_73 = 0;
  local_9a = 0;
  local_9b = 0;
  local_c2 = 0;
  local_c3 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar1,&local_39);
  bVar2 = isinteger(&local_38);
  local_1f1 = false;
  if (bVar2) {
    pcVar1 = local_18[5];
    std::allocator<char>::allocator();
    local_72 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar1,&local_71);
    local_73 = 1;
    bVar2 = isinteger(&local_70);
    local_1f1 = false;
    if (bVar2) {
      pcVar1 = local_18[6];
      std::allocator<char>::allocator();
      local_9a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar1,&local_99);
      local_9b = 1;
      bVar2 = isinteger(&local_98);
      local_1f1 = false;
      if (bVar2) {
        pcVar1 = local_18[7];
        std::allocator<char>::allocator();
        local_c2 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&x1,pcVar1,&local_c1);
        local_c3 = 1;
        local_1f1 = isinteger((string *)&x1);
      }
    }
  }
  if ((local_c3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&x1);
  }
  if ((local_c2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_c1);
  }
  if ((local_9b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((local_9a & 1) != 0) {
    std::allocator<char>::~allocator(&local_99);
  }
  if ((local_73 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_72 & 1) != 0) {
    std::allocator<char>::~allocator(&local_71);
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (local_1f1 == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"Invalid co-ordinates detected. Aborting.",&local_1d9);
    print_ln(&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
  }
  else {
    pcVar1 = local_18[4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&y1,pcVar1,&local_e9);
    iVar3 = std::__cxx11::stoi((string *)&y1,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&y1);
    std::allocator<char>::~allocator(&local_e9);
    pcVar1 = local_18[5];
    local_c8 = iVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&x2,pcVar1,&local_111);
    iVar3 = std::__cxx11::stoi((string *)&x2,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&x2);
    std::allocator<char>::~allocator(&local_111);
    pcVar1 = local_18[6];
    local_f0 = iVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&y2,pcVar1,&local_139);
    iVar3 = std::__cxx11::stoi((string *)&y2,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&y2);
    std::allocator<char>::~allocator(&local_139);
    pcVar1 = local_18[7];
    local_118 = iVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,pcVar1,&local_161);
    iVar3 = std::__cxx11::stoi(&local_160,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    pcVar1 = local_18[2];
    local_140 = iVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,pcVar1,&local_189);
    pcVar1 = local_18[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,pcVar1,&local_1b1);
    execute_slice(&local_188,&local_1b0,local_c8,local_f0,local_118,local_140);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
  }
  return;
}

Assistant:

void UI::gather_slice_arg(int &argc, char *argv[])
{
    if( (isinteger(argv[4]))
     && (isinteger(argv[5]))
     && (isinteger(argv[6]))
     && (isinteger(argv[7])) )
    {
        int x1 = std::stoi(argv[4]);
        int y1 = std::stoi(argv[5]);
        int x2 = std::stoi(argv[6]);
        int y2 = std::stoi(argv[7]);
        execute_slice(argv[2],argv[3],x1,y1,x2,y2);
    }
    else
    {
        print_ln("Invalid co-ordinates detected. Aborting.");
    }
}